

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDerivateTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::TextureDerivateCase::verify
          (TextureDerivateCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  Vec4 *scale;
  ostringstream *poVar1;
  int iVar2;
  Precision PVar3;
  ulong uVar4;
  bool bVar5;
  int i;
  int i_2;
  DataType DVar6;
  int iVar7;
  long lVar8;
  undefined7 extraout_var;
  undefined8 uVar9;
  undefined7 extraout_var_00;
  NotSupportedError *this_00;
  long lVar10;
  Vec4 *pVVar11;
  long lVar12;
  MessageBuilder *this_01;
  uint uVar13;
  float fVar14;
  undefined4 uVar15;
  float fVar16;
  Vector<float,_3> res_13;
  float fStack_2ac;
  Vector<float,_2> res_8;
  Vec4 threshold;
  Vec4 reference;
  Vector<float,_4> res;
  Vec4 opThreshold;
  float local_24c [4];
  float local_23c;
  Vec4 surfaceThreshold;
  Vec4 yScale;
  Vec4 xScale;
  PixelBufferAccess maskArea;
  ConstPixelBufferAccess compareArea;
  Vector<float,_4> res_3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [5];
  ios_base local_140 [272];
  
  uVar4 = stack0xfffffffffffffd50;
  if (1 < *(int *)(ctx + 8)) {
    if (1 < *(int *)(ctx + 0xc)) {
      tcu::getSubregion(&compareArea,(ConstPixelBufferAccess *)ctx,1,1,*(int *)(ctx + 8) + -2,
                        *(int *)(ctx + 0xc) + -2);
      tcu::getSubregion(&maskArea,(PixelBufferAccess *)sig,1,1,*(int *)(sig + 8) + -2,
                        *(int *)(sig + 0xc) + -2);
      xScale.m_data[0] = 1.0;
      xScale.m_data[1] = 0.0;
      xScale.m_data[2] = 0.5;
      xScale.m_data[3] = -0.5;
      yScale.m_data[0] = 0.0;
      yScale.m_data[1] = 1.0;
      yScale.m_data[2] = 0.5;
      yScale.m_data[3] = -0.5;
      iVar7 = *(int *)(ctx + 8);
      iVar2 = *(int *)(ctx + 0xc);
      TriangleDerivateCase::getSurfaceThreshold((TriangleDerivateCase *)&res_3);
      scale = &(this->super_TriangleDerivateCase).m_derivScale;
      res.m_data[0] = 0.0;
      res.m_data[1] = 0.0;
      res.m_data[2] = 0.0;
      res.m_data[3] = 0.0;
      lVar8 = 0;
      do {
        fVar14 = scale->m_data[lVar8];
        fVar16 = -fVar14;
        if (-fVar14 <= fVar14) {
          fVar16 = fVar14;
        }
        res.m_data[lVar8] = fVar16;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
      local_24c[3] = (float)iVar7;
      surfaceThreshold.m_data[0] = 0.0;
      surfaceThreshold.m_data[1] = 0.0;
      surfaceThreshold.m_data[2] = 0.0;
      surfaceThreshold.m_data[3] = 0.0;
      lVar8 = 0;
      do {
        surfaceThreshold.m_data[lVar8] = res_3.m_data[lVar8] / res.m_data[lVar8];
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
      local_23c = (float)iVar2;
      uVar13 = *(uint *)&(this->super_TriangleDerivateCase).field_0xf4;
      if (uVar13 < 2) {
        pVVar11 = &yScale;
        if (uVar13 == 0) {
          pVVar11 = &xScale;
        }
        res.m_data._0_8_ = *(undefined8 *)pVVar11->m_data;
        res.m_data._8_8_ = *(undefined8 *)(pVVar11->m_data + 2);
        opThreshold.m_data[0] = 0.0;
        opThreshold.m_data[1] = 0.0;
        opThreshold.m_data[2] = 0.0;
        opThreshold.m_data[3] = 0.0;
        lVar8 = 0;
        do {
          opThreshold.m_data[lVar8] =
               (this->m_texValueMax).m_data[lVar8] - (this->m_texValueMin).m_data[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        fVar14 = local_24c[3];
        if (uVar13 != 0) {
          fVar14 = local_23c;
        }
        res_3.m_data[0] = 0.0;
        res_3.m_data[1] = 0.0;
        res_3.m_data[2] = 0.0;
        res_3.m_data[3] = 0.0;
        lVar8 = 0;
        do {
          res_3.m_data[lVar8] = opThreshold.m_data[lVar8] / fVar14;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        reference.m_data[0] = 0.0;
        reference.m_data[1] = 0.0;
        reference.m_data[2] = 0.0;
        reference.m_data[3] = 0.0;
        lVar8 = 0;
        do {
          reference.m_data[lVar8] = res_3.m_data[lVar8] * res.m_data[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        PVar3 = (this->super_TriangleDerivateCase).m_precision;
        res_3.m_data[0] = 0.0;
        res_3.m_data[1] = 0.0;
        res_3.m_data[2] = 0.0;
        res_3.m_data[3] = 0.0;
        lVar8 = 0;
        do {
          res_3.m_data[lVar8] = (this->m_texValueMin).m_data[lVar8] * res.m_data[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        threshold.m_data[0] = 0.0;
        threshold.m_data[1] = 0.0;
        threshold.m_data[2] = 0.0;
        threshold.m_data[3] = 0.0;
        lVar8 = 0;
        do {
          threshold.m_data[lVar8] = (this->m_texValueMax).m_data[lVar8] * res.m_data[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        getDerivateThreshold((Functional *)&opThreshold,PVar3,&res_3,&threshold,&reference);
        threshold.m_data[0] = 0.0;
        threshold.m_data[1] = 0.0;
        threshold.m_data[2] = 0.0;
        threshold.m_data[3] = 0.0;
        lVar8 = 0;
        do {
          uVar13 = -(uint)(opThreshold.m_data[lVar8] <= surfaceThreshold.m_data[lVar8]);
          threshold.m_data[lVar8] =
               (float)(~uVar13 & (uint)opThreshold.m_data[lVar8] |
                      (uint)surfaceThreshold.m_data[lVar8] & uVar13);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        DVar6 = glu::getDataTypeFloatScalars((this->super_TriangleDerivateCase).m_dataType);
        res_3.m_data._0_8_ =
             ((this->super_TriangleDerivateCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
        poVar1 = (ostringstream *)(res_3.m_data + 2);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Verifying result image.\n",0x18);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"\tValid derivative is ",0x15);
        if (DVar6 == TYPE_FLOAT_VEC3) {
          res_8.m_data[0] = reference.m_data[0];
          res_8.m_data[1] = reference.m_data[1];
          tcu::operator<<((ostream *)poVar1,(Vector<float,_3> *)&res_8);
        }
        else if (DVar6 == TYPE_FLOAT_VEC2) {
          res_8.m_data[0] = reference.m_data[0];
          res_8.m_data[1] = reference.m_data[1];
          tcu::operator<<((ostream *)poVar1,&res_8);
        }
        else if (DVar6 == TYPE_FLOAT) {
          std::ostream::_M_insert<double>((double)reference.m_data[0]);
        }
        else {
          tcu::operator<<((ostream *)poVar1,&reference);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1," with threshold ",0x10);
        if (DVar6 == TYPE_FLOAT_VEC3) {
          res_8.m_data[0] = threshold.m_data[0];
          res_8.m_data[1] = threshold.m_data[1];
          tcu::operator<<((ostream *)poVar1,(Vector<float,_3> *)&res_8);
        }
        else if (DVar6 == TYPE_FLOAT_VEC2) {
          res_8.m_data[0] = threshold.m_data[0];
          res_8.m_data[1] = threshold.m_data[1];
          tcu::operator<<((ostream *)poVar1,&res_8);
        }
        else if (DVar6 == TYPE_FLOAT) {
          std::ostream::_M_insert<double>((double)threshold.m_data[0]);
        }
        else {
          tcu::operator<<((ostream *)poVar1,&threshold);
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&res_3,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_140);
        pVVar11 = &(this->super_TriangleDerivateCase).m_derivBias;
        bVar5 = verifyConstantDerivate
                          (((this->super_TriangleDerivateCase).super_TestCase.super_TestCase.
                            super_TestNode.m_testCtx)->m_log,&compareArea,&maskArea,
                           (this->super_TriangleDerivateCase).m_dataType,&reference,&threshold,scale
                           ,pVVar11,LOG_NOTHING);
        if (bVar5) {
          res_3.m_data._0_8_ =
               ((this->super_TriangleDerivateCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx)->m_log;
          poVar1 = (ostringstream *)(res_3.m_data + 2);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"No incorrect derivatives found, result valid.",0x2d);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&res_3,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          uVar9 = std::ios_base::~ios_base(local_140);
          iVar7 = (int)CONCAT71((int7)((ulong)uVar9 >> 8),1);
        }
        else {
          res_3.m_data._0_8_ =
               ((this->super_TriangleDerivateCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx)->m_log;
          poVar1 = (ostringstream *)(res_3.m_data + 2);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,
                     "Initial verification failed, verifying image by calculating accurate error bounds for each result pixel.\n"
                     ,0x69);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,
                     "\tVerifying each result derivative is within its range of legal result values."
                     ,0x4d);
          this_01 = (MessageBuilder *)&res_3;
          tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          std::ios_base::~ios_base(local_140);
          res_8.m_data[0] = 0.0;
          res_8.m_data[1] = 0.0;
          lVar8 = 0;
          do {
            res_8.m_data[lVar8] =
                 (this->m_texValueMax).m_data[lVar8] - (this->m_texValueMin).m_data[lVar8];
            lVar8 = lVar8 + 1;
          } while (lVar8 != 4);
          local_198[0]._M_allocated_capacity = 0;
          local_198[0]._8_8_ = 0;
          local_1a8._M_allocated_capacity = 0;
          local_1a8._8_8_ = 0;
          res_3.m_data[0] = 0.0;
          res_3.m_data[1] = 0.0;
          res_3.m_data[2] = 0.0;
          res_3.m_data[3] = 0.0;
          lVar8 = 0;
          lVar10 = 0;
          do {
            lVar12 = 0;
            do {
              uVar15 = 0x3f800000;
              if (lVar8 != lVar12) {
                uVar15 = 0;
              }
              *(undefined4 *)((long)&this_01->m_log + lVar12) = uVar15;
              lVar12 = lVar12 + 0x10;
            } while (lVar12 != 0x30);
            lVar10 = lVar10 + 1;
            this_01 = (MessageBuilder *)((long)&this_01->m_log + 4);
            lVar8 = lVar8 + 0x10;
          } while (lVar10 != 4);
          res_13.m_data[1] = 0.0;
          res_13.m_data[0] = res_8.m_data[0] / local_24c[3];
          res_13.m_data[2] = (this->m_texValueMin).m_data[0];
          lVar8 = 0;
          do {
            res_3.m_data[lVar8] = *(float *)((long)res_13.m_data + lVar8);
            lVar8 = lVar8 + 4;
          } while (lVar8 != 0xc);
          res_13.m_data._0_8_ = (ulong)(uint)(res_8.m_data[1] / local_23c) << 0x20;
          res_13.m_data[2] = (this->m_texValueMin).m_data[1];
          lVar8 = 1;
          do {
            res_3.m_data[lVar8] = *(float *)(&stack0xfffffffffffffd47 + lVar8);
            lVar8 = lVar8 + 4;
          } while (lVar8 != 0xd);
          fVar14 = (this->m_texValueMin).m_data[2];
          local_24c[0] = 0.0 / local_24c[3];
          local_24c[1] = 0.0 / local_23c;
          local_24c[2] = fVar14 + fVar14;
          res_13.m_data[0] = 0.0;
          res_13.m_data[1] = 0.0;
          stack0xfffffffffffffd50 = uVar4 & 0xffffffff00000000;
          lVar8 = 0;
          do {
            res_13.m_data[lVar8] = local_24c[lVar8] * 0.5;
            lVar8 = lVar8 + 1;
          } while (lVar8 != 3);
          lVar8 = 2;
          do {
            res_3.m_data[lVar8] = *(float *)(&stack0xfffffffffffffd46 + lVar8);
            lVar8 = lVar8 + 4;
          } while (lVar8 != 0xe);
          fVar14 = (this->m_texValueMax).m_data[3];
          local_24c[0] = -0.0 / local_24c[3];
          local_24c[1] = -0.0 / local_23c;
          local_24c[2] = fVar14 + fVar14;
          res_13.m_data[0] = 0.0;
          res_13.m_data[1] = 0.0;
          stack0xfffffffffffffd50 = stack0xfffffffffffffd50 & 0xffffffff00000000;
          lVar8 = 0;
          do {
            res_13.m_data[lVar8] = local_24c[lVar8] * 0.5;
            lVar8 = lVar8 + 1;
          } while (lVar8 != 3);
          lVar8 = 3;
          do {
            res_3.m_data[lVar8] = *(float *)(&stack0xfffffffffffffd45 + lVar8);
            lVar8 = lVar8 + 4;
          } while (lVar8 != 0xf);
          bVar5 = reverifyConstantDerivateWithFlushRelaxations
                            (((this->super_TriangleDerivateCase).super_TestCase.super_TestCase.
                              super_TestNode.m_testCtx)->m_log,&compareArea,&maskArea,
                             (this->super_TriangleDerivateCase).m_dataType,
                             (this->super_TriangleDerivateCase).m_precision,scale,pVVar11,
                             &surfaceThreshold,
                             *(DerivateFunc *)&(this->super_TriangleDerivateCase).field_0xf4,
                             (Linear2DFunctionEvaluator *)&res_3);
          iVar7 = (int)CONCAT71(extraout_var_00,bVar5);
        }
      }
      else {
        reference.m_data[0] = 0.0;
        reference.m_data[1] = 0.0;
        reference.m_data[2] = 0.0;
        reference.m_data[3] = 0.0;
        lVar8 = 0;
        do {
          reference.m_data[lVar8] =
               (this->m_texValueMax).m_data[lVar8] - (this->m_texValueMin).m_data[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        res.m_data[0] = 0.0;
        res.m_data[1] = 0.0;
        res.m_data[2] = 0.0;
        res.m_data[3] = 0.0;
        lVar8 = 0;
        do {
          res.m_data[lVar8] = reference.m_data[lVar8] / local_24c[3];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        res_3.m_data[0] = 0.0;
        res_3.m_data[1] = 0.0;
        res_3.m_data[2] = 0.0;
        res_3.m_data[3] = 0.0;
        lVar8 = 0;
        do {
          res_3.m_data[lVar8] = res.m_data[lVar8] * xScale.m_data[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        opThreshold.m_data[0] = 0.0;
        opThreshold.m_data[1] = 0.0;
        opThreshold.m_data[2] = 0.0;
        opThreshold.m_data[3] = 0.0;
        lVar8 = 0;
        do {
          opThreshold.m_data[lVar8] =
               (this->m_texValueMax).m_data[lVar8] - (this->m_texValueMin).m_data[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        reference.m_data[0] = 0.0;
        reference.m_data[1] = 0.0;
        reference.m_data[2] = 0.0;
        reference.m_data[3] = 0.0;
        lVar8 = 0;
        do {
          reference.m_data[lVar8] = opThreshold.m_data[lVar8] / local_23c;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        res.m_data[0] = 0.0;
        res.m_data[1] = 0.0;
        res.m_data[2] = 0.0;
        res.m_data[3] = 0.0;
        lVar8 = 0;
        do {
          res.m_data[lVar8] = reference.m_data[lVar8] * yScale.m_data[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        opThreshold.m_data[0] = 0.0;
        opThreshold.m_data[1] = 0.0;
        opThreshold.m_data[2] = 0.0;
        opThreshold.m_data[3] = 0.0;
        lVar8 = 0;
        do {
          fVar14 = res_3.m_data[lVar8];
          fVar16 = -fVar14;
          if (-fVar14 <= fVar14) {
            fVar16 = fVar14;
          }
          opThreshold.m_data[lVar8] = fVar16;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        threshold.m_data[0] = 0.0;
        threshold.m_data[1] = 0.0;
        threshold.m_data[2] = 0.0;
        threshold.m_data[3] = 0.0;
        lVar8 = 0;
        do {
          fVar14 = res.m_data[lVar8];
          fVar16 = -fVar14;
          if (-fVar14 <= fVar14) {
            fVar16 = fVar14;
          }
          threshold.m_data[lVar8] = fVar16;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        reference.m_data[0] = 0.0;
        reference.m_data[1] = 0.0;
        reference.m_data[2] = 0.0;
        reference.m_data[3] = 0.0;
        lVar8 = 0;
        do {
          reference.m_data[lVar8] = opThreshold.m_data[lVar8] + threshold.m_data[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        PVar3 = (this->super_TriangleDerivateCase).m_precision;
        threshold.m_data[0] = 0.0;
        threshold.m_data[1] = 0.0;
        threshold.m_data[2] = 0.0;
        threshold.m_data[3] = 0.0;
        lVar8 = 0;
        do {
          threshold.m_data[lVar8] = (this->m_texValueMin).m_data[lVar8] * xScale.m_data[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        res_8.m_data[0] = 0.0;
        res_8.m_data[1] = 0.0;
        lVar8 = 0;
        do {
          res_8.m_data[lVar8] = (this->m_texValueMax).m_data[lVar8] * xScale.m_data[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        getDerivateThreshold((Functional *)&opThreshold,PVar3,&threshold,(Vec4 *)&res_8,&res_3);
        res_8.m_data[0] = 0.0;
        res_8.m_data[1] = 0.0;
        lVar8 = 0;
        do {
          res_8.m_data[lVar8] = (this->m_texValueMin).m_data[lVar8] * yScale.m_data[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        res_13.m_data[0] = 0.0;
        res_13.m_data[1] = 0.0;
        res_13.m_data[2] = 0.0;
        fStack_2ac = 0.0;
        lVar8 = 0;
        do {
          res_13.m_data[lVar8] = (this->m_texValueMax).m_data[lVar8] * yScale.m_data[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        getDerivateThreshold((Functional *)&threshold,PVar3,(Vec4 *)&res_8,(Vec4 *)&res_13,&res);
        res_13.m_data[0] = 0.0;
        res_13.m_data[1] = 0.0;
        res_13.m_data[2] = 0.0;
        fStack_2ac = 0.0;
        lVar8 = 0;
        do {
          uVar13 = -(uint)(threshold.m_data[lVar8] <= opThreshold.m_data[lVar8]);
          res_13.m_data[lVar8] =
               (float)(~uVar13 & (uint)threshold.m_data[lVar8] |
                      (uint)opThreshold.m_data[lVar8] & uVar13);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        res_8.m_data[0] = 0.0;
        res_8.m_data[1] = 0.0;
        lVar8 = 0;
        do {
          uVar13 = -(uint)(res_13.m_data[lVar8] <= surfaceThreshold.m_data[lVar8]);
          res_8.m_data[lVar8] =
               (float)(~uVar13 & (uint)res_13.m_data[lVar8] |
                      (uint)surfaceThreshold.m_data[lVar8] & uVar13);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        bVar5 = verifyConstantDerivate
                          (((this->super_TriangleDerivateCase).super_TestCase.super_TestCase.
                            super_TestNode.m_testCtx)->m_log,&compareArea,&maskArea,
                           (this->super_TriangleDerivateCase).m_dataType,&reference,(Vec4 *)&res_8,
                           scale,&(this->super_TriangleDerivateCase).m_derivBias,LOG_ALL);
        iVar7 = (int)CONCAT71(extraout_var,bVar5);
      }
      return iVar7;
    }
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  res_3.m_data._0_8_ = &local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&res_3,"Too small viewport","");
  tcu::NotSupportedError::NotSupportedError(this_00,(string *)&res_3);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void gen (void)
	{
		DE_ASSERT(!m_fbo);
		m_gl.genFramebuffers(1, &m_fbo);
	}